

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O2

int main(int argc,char **argv)

{
  pointer puVar1;
  size_type sVar2;
  undefined8 uVar3;
  bool bVar4;
  __pid_t _Var5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ostream *poVar9;
  size_type sVar10;
  any *paVar11;
  uint *puVar12;
  double *pdVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  mapped_type *pmVar15;
  istream *piVar16;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  _Rb_tree_node_base *p_Var19;
  mapped_type *pmVar20;
  size_type sVar21;
  mapped_type *pmVar22;
  mapped_type *pmVar23;
  Tensor *t;
  long lVar24;
  long lVar25;
  long lVar26;
  mapped_type *sentenceUnkStrings;
  uint i_2;
  uint uVar27;
  ulong uVar28;
  char *pcVar29;
  uint *w_2;
  key_type_conflict *pkVar30;
  uint i;
  uint uVar31;
  ulong uVar32;
  uint *w;
  pointer ppNVar33;
  _Alloc_hider __x;
  float fVar34;
  real rVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  double local_ca0;
  double local_c98;
  uint kUNK;
  double local_c88;
  double local_c80;
  allocator local_c72;
  allocator local_c71;
  ulong local_c70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c68;
  int local_c60;
  int argc_local;
  vector<float,_std::allocator<float>_> v;
  double right;
  uint local_c04;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pred;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  double right_1;
  char **argv_local;
  double local_b98;
  double dStack_b90;
  string line;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tsentence_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pred_1;
  string fname;
  double right_2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> training_vocab;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> hyp;
  variables_map conf;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_9f0 [144];
  istringstream lin;
  undefined4 uStack_95c;
  undefined1 local_958 [512];
  Model model;
  string local_700;
  string local_6e0;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> singletons;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  ParserBuilder parser;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  ostringstream os;
  
  argc_local = argc;
  argv_local = argv;
  cnn::Initialize(&argc_local,&argv_local,0,false);
  std::operator<<((ostream *)&std::cerr,"COMMAND:");
  for (uVar32 = 0; uVar32 < (uint)argc_local; uVar32 = uVar32 + 1) {
    poVar9 = std::operator<<((ostream *)&std::cerr,' ');
    std::operator<<(poVar9,argv_local[uVar32]);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  boost::program_options::variables_map::variables_map(&conf);
  InitCommandLine(argc_local,argv_local,&conf);
  std::__cxx11::string::string((string *)&parser,"use_pos_tags",(allocator *)&lin);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_9f0,(key_type *)&parser);
  USE_POS = sVar10 != 0;
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::string((string *)&parser,"use_spelling",(allocator *)&lin);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_9f0,(key_type *)&parser);
  USE_SPELLING = sVar10 != 0;
  std::__cxx11::string::~string((string *)&parser);
  corpus.USE_SPELLING = USE_SPELLING;
  std::__cxx11::string::string((string *)&parser,"layers",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar12 = boost::any_cast<unsigned_int_const&>(paVar11);
  LAYERS = *puVar12;
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::string((string *)&parser,"input_dim",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar12 = boost::any_cast<unsigned_int_const&>(paVar11);
  INPUT_DIM = *puVar12;
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::string((string *)&parser,"pretrained_dim",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar12 = boost::any_cast<unsigned_int_const&>(paVar11);
  PRETRAINED_DIM = *puVar12;
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::string((string *)&parser,"hidden_dim",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar12 = boost::any_cast<unsigned_int_const&>(paVar11);
  HIDDEN_DIM = *puVar12;
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::string((string *)&parser,"action_dim",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar12 = boost::any_cast<unsigned_int_const&>(paVar11);
  ACTION_DIM = *puVar12;
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::string((string *)&parser,"lstm_input_dim",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar12 = boost::any_cast<unsigned_int_const&>(paVar11);
  LSTM_INPUT_DIM = *puVar12;
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::string((string *)&parser,"pos_dim",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar12 = boost::any_cast<unsigned_int_const&>(paVar11);
  POS_DIM = *puVar12;
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::string((string *)&parser,"rel_dim",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar12 = boost::any_cast<unsigned_int_const&>(paVar11);
  REL_DIM = *puVar12;
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::string((string *)&parser,"beam_size",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar12 = boost::any_cast<unsigned_int_const&>(paVar11);
  local_c04 = *puVar12;
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::string((string *)&parser,"unk_strategy",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar12 = boost::any_cast<unsigned_int_const&>(paVar11);
  uVar6 = *puVar12;
  std::__cxx11::string::~string((string *)&parser);
  std::operator<<((ostream *)&std::cerr,"Unknown word strategy: ");
  if (uVar6 != 1) {
    abort();
  }
  std::operator<<((ostream *)&std::cerr,"STOCHASTIC REPLACEMENT\n");
  std::__cxx11::string::string((string *)&parser,"unk_prob",(allocator *)&lin);
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  pdVar13 = boost::any_cast<double_const&>(paVar11);
  local_c68 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)*pdVar13;
  std::__cxx11::string::~string((string *)&parser);
  if ((double)local_c68 < 0.0) {
    pcVar29 = "unk_prob >= 0.";
  }
  else {
    if ((double)local_c68 <= 1.0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
      poVar9 = std::operator<<((ostream *)&os,"parser_");
      pcVar29 = "nopos";
      if (USE_POS != false) {
        pcVar29 = "pos";
      }
      poVar9 = std::operator<<(poVar9,pcVar29);
      poVar9 = std::operator<<(poVar9,'_');
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,'_');
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,'_');
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,'_');
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,'_');
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,'_');
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,'_');
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,"-pid");
      _Var5 = getpid();
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,_Var5);
      std::operator<<(poVar9,".params");
      std::__cxx11::stringbuf::str();
      poVar9 = std::operator<<((ostream *)&std::cerr,"Writing parameters to file: ");
      poVar9 = std::operator<<(poVar9,(string *)&fname);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::string((string *)&parser,"training_data",(allocator *)&lin);
      paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
      pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar11);
      std::__cxx11::string::string((string *)&local_6e0,(string *)pbVar14);
      cpyp::Corpus::load_correct_actions(&corpus,&local_6e0);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::string((string *)&parser,"UNK",(allocator *)&lin);
      uVar6 = cpyp::Corpus::get_or_add_word(&corpus,(string *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      kUNK = uVar6;
      std::__cxx11::string::string((string *)&parser,"ROOT",(allocator *)&lin);
      kROOT_SYMBOL = cpyp::Corpus::get_or_add_word(&corpus,(string *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::string((string *)&parser,"words",(allocator *)&lin);
      sVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_9f0,(key_type *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      if (sVar10 != 0) {
        _lin = _lin & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&parser,(ulong)PRETRAINED_DIM,
                   (value_type_conflict2 *)&lin,(allocator_type *)&line);
        pmVar15 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pretrained,&kUNK);
        std::vector<float,_std::allocator<float>_>::_M_move_assign(pmVar15,&parser);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&parser);
        poVar9 = std::operator<<((ostream *)&std::cerr,"Loading from ");
        std::__cxx11::string::string((string *)&parser,"words",(allocator *)&lin);
        paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf)
        ;
        pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar11);
        poVar9 = std::operator<<(poVar9,(string *)pbVar14);
        poVar9 = std::operator<<(poVar9," with");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::operator<<(poVar9," dimensions\n");
        std::__cxx11::string::~string((string *)&parser);
        std::__cxx11::string::string((string *)&lin,"words",(allocator *)&line);
        paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf)
        ;
        pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar11);
        std::ifstream::ifstream(&parser,(pbVar14->_M_dataplus)._M_p,_S_in);
        std::__cxx11::string::~string((string *)&lin);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_allocated_capacity = line.field_2._M_allocated_capacity & 0xffffffffffffff00
        ;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&parser,(string *)&line);
        _lin = _lin & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::vector
                  (&v,(ulong)PRETRAINED_DIM,(value_type_conflict2 *)&lin,(allocator_type *)&model);
        model.all_params.
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&model.all_params.
                       super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        model.all_params.
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        model.all_params.
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)model.all_params.
                              super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        while (piVar16 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)&parser,(string *)&line),
              ((byte)piVar16[*(long *)(*(long *)piVar16 + -0x18) + 0x20] & 5) == 0) {
          std::__cxx11::istringstream::istringstream((istringstream *)&lin,(string *)&line,_S_in);
          std::operator>>((istream *)&lin,(string *)&model);
          for (uVar32 = 0; uVar32 < PRETRAINED_DIM; uVar32 = uVar32 + 1) {
            std::istream::_M_extract<float>((float *)&lin);
          }
          training_vocab._M_t._M_impl._0_4_ =
               cpyp::Corpus::get_or_add_word(&corpus,(string *)&model);
          pmVar15 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&pretrained,(key_type *)&training_vocab);
          std::vector<float,_std::allocator<float>_>::operator=(pmVar15,&v);
          std::__cxx11::istringstream::~istringstream((istringstream *)&lin);
        }
        std::__cxx11::string::~string((string *)&model);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&v.super__Vector_base<float,_std::allocator<float>_>);
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream(&parser);
      }
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &training_vocab._M_t._M_impl.super__Rb_tree_header._M_header;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &singletons._M_t._M_impl.super__Rb_tree_header._M_header;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      parser.stack_lstm.super_RNNBuilder.head.
      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
      super__Vector_impl_data._M_finish = &parser.stack_lstm.super_RNNBuilder.cur;
      parser.stack_lstm.super_RNNBuilder.cur.t = 0;
      parser.stack_lstm.super_RNNBuilder.head.
      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parser.stack_lstm.params.
      super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      parser.stack_lstm.super_RNNBuilder.head.
      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           parser.stack_lstm.super_RNNBuilder.head.
           super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
           super__Vector_impl_data._M_finish;
      for (p_Var18 = corpus.sentences._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var18 != &corpus.sentences._M_t._M_impl.super__Rb_tree_header;
          p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
        std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::pair
                  ((pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &lin,(pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         *)(p_Var18 + 1));
        uVar3 = local_958._8_8_;
        for (ppNVar33 = (pointer)local_958._0_8_; ppNVar33 != (pointer)uVar3;
            ppNVar33 = (pointer)((long)ppNVar33 + 4)) {
          line._M_dataplus._M_p._0_4_ = *(uint *)ppNVar33;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&training_vocab,(uint *)&line);
          pmVar17 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)&parser,(key_type_conflict *)&line);
          *pmVar17 = *pmVar17 + 1;
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_958);
      }
      for (p_Var19 = (_Rb_tree_node_base *)
                     parser.stack_lstm.super_RNNBuilder.head.
                     super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          p_Var19 != (_Rb_tree_node_base *)&parser.stack_lstm.super_RNNBuilder.cur;
          p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
        _lin = *(pointer *)(p_Var19 + 1);
        if ((int)((ulong)_lin >> 0x20) == 1) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&singletons,(uint *)&lin);
        }
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&parser);
      poVar9 = std::operator<<((ostream *)&std::cerr,"Number of words: ");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::endl<char,std::char_traits<char>>(poVar9);
      VOCAB_SIZE = corpus.nwords + 1;
      poVar9 = std::operator<<((ostream *)&std::cerr,"Number of UTF8 chars: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,corpus.maxChars);
      std::endl<char,std::char_traits<char>>(poVar9);
      if (0xff < corpus.maxChars) {
        CHAR_SIZE = corpus.maxChars;
      }
      ACTION_SIZE = corpus.nactions + 1;
      POS_SIZE = corpus.npos + 10;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&possible_actions,(ulong)corpus.nactions);
      puVar1 = possible_actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (uVar32 = 0; uVar32 < corpus.nactions; uVar32 = uVar32 + 1) {
        puVar1[uVar32] = (uint)uVar32;
      }
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.gradient_norm_scratch = (float *)0x0;
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ParserBuilder::ParserBuilder(&parser,&model,&pretrained);
      std::__cxx11::string::string((string *)&lin,"model",(allocator *)&line);
      sVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_9f0,(key_type *)&lin);
      std::__cxx11::string::~string((string *)&lin);
      if (sVar10 != 0) {
        std::__cxx11::string::string((string *)&line,"model",(allocator *)&v);
        paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf)
        ;
        pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar11);
        std::ifstream::ifstream(&lin,(pbVar14->_M_dataplus)._M_p,_S_in);
        std::__cxx11::string::~string((string *)&line);
        boost::archive::text_iarchive::text_iarchive((text_iarchive *)&line,(istream *)&lin,0);
        boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard
        ::invoke<cnn::Model>((text_iarchive *)&line,&model);
        boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
                  ((text_iarchive_impl<boost::archive::text_iarchive> *)&line);
        std::ifstream::~ifstream(&lin);
      }
      std::__cxx11::string::string((string *)&lin,"dev_data",(allocator *)&line);
      paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
      pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar11);
      std::__cxx11::string::string((string *)&local_700,(string *)pbVar14);
      cpyp::Corpus::load_correct_actionsDev(&corpus,&local_700);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&lin);
      if (USE_SPELLING == true) {
        VOCAB_SIZE = corpus.nwords + 1;
      }
      std::__cxx11::string::string((string *)&lin,"train",(allocator *)&line);
      sVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_9f0,(key_type *)&lin);
      std::__cxx11::string::~string((string *)&lin);
      if (sVar10 != 0) {
        signal(2,signal_callback_handler);
        cnn::SimpleSGDTrainer::SimpleSGDTrainer((SimpleSGDTrainer *)&v,&model,1e-06,0.1);
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)CONCAT44(v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,0x3da3d70a);
        poVar9 = std::operator<<((ostream *)&std::cerr,"Training started.");
        std::operator<<(poVar9,"\n");
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&order,(ulong)corpus.nsentences,(allocator_type *)&lin);
        for (uVar32 = 0; uVar28 = (ulong)corpus.nsentences, uVar32 < uVar28; uVar32 = uVar32 + 1) {
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar32] = (uint)uVar32;
        }
        uVar6 = 100;
        if (corpus.nsentences < 100) {
          uVar6 = corpus.nsentences;
        }
        poVar9 = std::operator<<((ostream *)&std::cerr,"NUMBER OF TRAINING SENTENCES: ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
        right = 0.0;
        bVar4 = false;
        local_c80 = 0.0;
        local_b98 = (double)CONCAT44(local_b98._4_4_,(int)CONCAT71((int7)((ulong)&right >> 8),1));
        local_c70 = CONCAT44(local_c70._4_4_,0xffffffff);
        local_c60 = 0;
        while (requested_stop == false) {
          local_c70 = CONCAT44(local_c70._4_4_,(int)local_c70 + 1);
          local_ca0 = 0.0;
          uVar27 = 0;
          uVar31 = 0;
          while( true ) {
            uVar7 = (uint)uVar28;
            if (uVar27 == uVar6) break;
            if (uVar7 == corpus.nsentences) {
              if (((ulong)local_b98 & 1) == 0) {
                fVar34 = v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ + 1.0;
                v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage =
                     (pointer)CONCAT44(fVar34,v.super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _0_4_);
                v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)CONCAT44(v.super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_finish._0_4_ /
                                              (fVar34 * v.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_ + 1.0),
                                              v.super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_finish._0_4_);
              }
              std::operator<<((ostream *)&std::cerr,"**SHUFFLE\n");
              local_b98 = (double)((ulong)local_b98 & 0xffffffff00000000);
              std::
              random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                        ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
              uVar7 = 0;
            }
            local_c80 = local_c80 + 1.0;
            _lin = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
            pmVar20 = std::
                      map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator[](&corpus.sentences,(key_type *)&lin);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,pmVar20);
            sVar2 = line._M_string_length;
            for (__x = line._M_dataplus; __x._M_p != (pointer)sVar2; __x._M_p = __x._M_p + 4) {
              sVar21 = std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       count(&singletons,(key_type_conflict *)__x._M_p);
              if ((sVar21 != 0) && (rVar35 = cnn::rand01(), (double)rVar35 < (double)local_c68)) {
                *(uint *)__x._M_p = kUNK;
              }
            }
            _lin = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
            pmVar22 = std::
                      map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator[](&corpus.sentencesPos,(key_type *)&lin);
            _lin = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
            pmVar23 = std::
                      map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator[](&corpus.correct_act_sent,(key_type *)&lin);
            cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&lin);
            ParserBuilder::log_prob_parser
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c0,&parser,
                       (ComputationGraph *)&lin,pmVar20,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,pmVar22,pmVar23,
                       &corpus.actions,&corpus.intToWords,&right);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&local_1c0);
            t = cnn::ComputationGraph::incremental_forward((ComputationGraph *)&lin);
            rVar35 = cnn::as_scalar(t);
            local_c88 = (double)rVar35;
            if (rVar35 < 0.0) {
              poVar9 = std::operator<<((ostream *)&std::cerr,"Log prob < 0 on sentence ");
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
              std::operator<<(poVar9,": lp=");
              poVar9 = std::ostream::_M_insert<double>(local_c88);
              std::endl<char,std::char_traits<char>>(poVar9);
              __assert_fail("lp >= 0.0",
                            "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                            ,0x416,"int main(int, char **)");
            }
            cnn::ComputationGraph::backward((ComputationGraph *)&lin);
            cnn::SimpleSGDTrainer::update((SimpleSGDTrainer *)&v,1.0);
            local_ca0 = local_ca0 + local_c88;
            uVar28 = (ulong)(uVar7 + 1);
            uVar31 = uVar31 + (int)((ulong)((long)(pmVar23->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pmVar23->
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 )._M_impl.super__Vector_impl_data._M_start) >> 2);
            cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&lin);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&line);
            uVar27 = uVar27 + 1;
          }
          cnn::Trainer::status((Trainer *)&v);
          poVar9 = std::operator<<((ostream *)&std::cerr,"update #");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_c70);
          std::operator<<(poVar9," (epoch ");
          poVar9 = std::ostream::_M_insert<double>(local_c80 / (double)corpus.nsentences);
          std::operator<<(poVar9,")\tllh: ");
          poVar9 = std::ostream::_M_insert<double>(local_ca0);
          std::operator<<(poVar9," ppl: ");
          dVar41 = (double)uVar31;
          dVar36 = exp(local_ca0 / dVar41);
          poVar9 = std::ostream::_M_insert<double>(dVar36);
          std::operator<<(poVar9," err: ");
          poVar9 = std::ostream::_M_insert<double>((dVar41 - right) / dVar41);
          std::endl<char,std::char_traits<char>>(poVar9);
          uVar27 = corpus.nsentencesDev;
          right = 0.0;
          main::logc = main::logc + 1;
          if (main::logc % 0x19 == 1) {
            right_1 = 0.0;
            uVar31 = 0;
            local_c98 = 0.0;
            lVar24 = std::chrono::_V2::system_clock::now();
            local_ca0 = 0.0;
            local_c88 = 0.0;
            while( true ) {
              if (uVar31 == uVar27) break;
              _lin = uVar31;
              pmVar20 = std::
                        map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                        ::operator[](&corpus.sentencesDev,(key_type *)&lin);
              _lin = uVar31;
              pmVar22 = std::
                        map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                        ::operator[](&corpus.sentencesPosDev,(key_type *)&lin);
              _lin = uVar31;
              pmVar23 = std::
                        map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                        ::operator[](&corpus.correct_act_sentDev,(key_type *)&lin);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&tsentence_1,pmVar20)
              ;
              puVar1 = tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              pkVar30 = tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (USE_SPELLING == false) {
                for (; pkVar30 != puVar1; pkVar30 = pkVar30 + 1) {
                  sVar21 = std::
                           set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           ::count(&training_vocab,pkVar30);
                  if (sVar21 == 0) {
                    *pkVar30 = kUNK;
                  }
                }
              }
              cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&lin);
              line._M_dataplus._M_p = (pointer)0x0;
              line._M_string_length = 0;
              line.field_2._M_allocated_capacity = 0;
              ParserBuilder::log_prob_parser
                        (&pred,&parser,(ComputationGraph *)&lin,pmVar20,&tsentence_1,pmVar22,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,
                         &corpus.actions,&corpus.intToWords,&right_1);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&line);
              lVar25 = (long)(pmVar23->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar23->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start;
              lVar26 = lVar25 >> 2;
              auVar37._8_4_ = (int)(lVar25 >> 0x22);
              auVar37._0_8_ = lVar26;
              auVar37._12_4_ = 0x45300000;
              ParserBuilder::compute_heads
                        ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&line,(uint)((ulong)((long)(pmVar20->
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(pmVar20->
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2),
                         pmVar23,&corpus.actions,
                         (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)0x0);
              ParserBuilder::compute_heads
                        ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&hyp._M_t,
                         (uint)((ulong)((long)(pmVar20->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pmVar20->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 2),&pred
                         ,&corpus.actions,
                         (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)0x0);
              uVar7 = compute_correct((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                       *)&line,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&hyp._M_t,
                                      (int)((ulong)((long)(pmVar20->
                                                                                                                    
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar20->
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2)
                                      - 1);
              local_c98 = local_c98 +
                          (auVar37._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar26) - 4503599627370496.0);
              local_ca0 = local_ca0 + (double)uVar7;
              lVar25 = ((long)(pmVar20->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pmVar20->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2) + -1;
              auVar38._8_4_ = (int)((ulong)lVar25 >> 0x20);
              auVar38._0_8_ = lVar25;
              auVar38._12_4_ = 0x45300000;
              local_c88 = local_c88 +
                          (auVar38._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0);
              std::
              _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::~_Rb_tree(&hyp._M_t);
              std::
              _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&line);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
              cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&lin);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&tsentence_1.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
              uVar31 = uVar31 + 1;
            }
            lVar25 = std::chrono::_V2::system_clock::now();
            poVar9 = std::operator<<((ostream *)&std::cerr,"  **dev (iter=");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_c70);
            std::operator<<(poVar9," epoch=");
            poVar9 = std::ostream::_M_insert<double>(local_c80 / (double)corpus.nsentences);
            std::operator<<(poVar9,")\tllh=");
            poVar9 = std::ostream::_M_insert<double>(0.0);
            std::operator<<(poVar9," ppl: ");
            dVar36 = exp(0.0 / local_c98);
            poVar9 = std::ostream::_M_insert<double>(dVar36);
            std::operator<<(poVar9," err: ");
            poVar9 = std::ostream::_M_insert<double>((local_c98 - right_1) / local_c98);
            std::operator<<(poVar9," uas: ");
            poVar9 = std::ostream::_M_insert<double>(local_ca0 / local_c88);
            poVar9 = std::operator<<(poVar9,"\t[");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::operator<<(poVar9," sents in ");
            poVar9 = std::ostream::_M_insert<double>((double)(lVar25 - lVar24) / 1000000.0);
            poVar9 = std::operator<<(poVar9," ms]");
            std::endl<char,std::char_traits<char>>(poVar9);
            if ((double)local_c60 < local_ca0) {
              std::ofstream::ofstream((ostream *)&lin,(string *)&fname,_S_out);
              boost::archive::text_oarchive::text_oarchive((text_oarchive *)&line,(ostream *)&lin,0)
              ;
              boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::
              save_standard::invoke<cnn::Model>((text_oarchive *)&line,&model);
              if (!bVar4) {
                std::__cxx11::string::string
                          ((string *)&hyp," latest_model",(allocator *)&tsentence_1);
                std::__cxx11::string::string((string *)&pred,"rm -f ",&local_c71);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &tsentence_1,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pred,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&hyp);
                iVar8 = system((char *)tsentence_1.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                if (iVar8 == 0) {
                  std::__cxx11::string::string((string *)&local_690,"ln -s ",&local_c72);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&right_2,&local_690,&fname);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pred_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&right_2,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&hyp);
                  iVar8 = system((char *)pred_1.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
                  std::__cxx11::string::~string((string *)&pred_1);
                  std::__cxx11::string::~string((string *)&right_2);
                  std::__cxx11::string::~string((string *)&local_690);
                  std::__cxx11::string::~string((string *)&tsentence_1);
                  std::__cxx11::string::~string((string *)&pred);
                  if (iVar8 == 0) {
                    poVar9 = std::operator<<((ostream *)&std::cerr,"Created ");
                    poVar9 = std::operator<<(poVar9,(string *)&hyp);
                    poVar9 = std::operator<<(poVar9," as a soft link to ");
                    poVar9 = std::operator<<(poVar9,(string *)&fname);
                    poVar9 = std::operator<<(poVar9," for convenience.");
                    std::endl<char,std::char_traits<char>>(poVar9);
                  }
                }
                else {
                  std::__cxx11::string::~string((string *)&tsentence_1);
                  std::__cxx11::string::~string((string *)&pred);
                }
                std::__cxx11::string::~string((string *)&hyp);
              }
              local_c60 = (int)local_ca0;
              boost::archive::text_oarchive_impl<boost::archive::text_oarchive>::~text_oarchive_impl
                        ((text_oarchive_impl<boost::archive::text_oarchive> *)&line);
              std::ofstream::~ofstream(&lin);
              bVar4 = true;
            }
          }
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        cnn::Trainer::~Trainer((Trainer *)&v);
      }
      right_2 = 0.0;
      lVar24 = std::chrono::_V2::system_clock::now();
      local_c70 = (ulong)corpus.nsentencesDev;
      iVar8 = 0;
      local_ca0 = 0.0;
      local_c80 = 0.0;
      local_c98 = 0.0;
      while( true ) {
        if (iVar8 == (int)local_c70) {
          lVar25 = std::chrono::_V2::system_clock::now();
          std::operator<<((ostream *)&std::cerr,"TEST llh=");
          poVar9 = std::ostream::_M_insert<double>(0.0);
          std::operator<<(poVar9," ppl: ");
          dVar36 = exp(0.0 / local_ca0);
          poVar9 = std::ostream::_M_insert<double>(dVar36);
          std::operator<<(poVar9," err: ");
          poVar9 = std::ostream::_M_insert<double>((local_ca0 - right_2) / local_ca0);
          std::operator<<(poVar9," uas: ");
          poVar9 = std::ostream::_M_insert<double>(local_c80 / local_c98);
          poVar9 = std::operator<<(poVar9,"\t[");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::operator<<(poVar9," sents in ");
          poVar9 = std::ostream::_M_insert<double>((double)(lVar25 - lVar24) / 1000000.0);
          poVar9 = std::operator<<(poVar9," ms]");
          std::endl<char,std::char_traits<char>>(poVar9);
          ParserBuilder::~ParserBuilder(&parser);
          cnn::Model::~Model(&model);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&singletons._M_t);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&training_vocab._M_t);
          std::__cxx11::string::~string((string *)&fname);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
          boost::program_options::variables_map::~variables_map(&conf);
          return 0;
        }
        _lin = iVar8;
        pmVar20 = std::
                  map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[](&corpus.sentencesDev,(key_type *)&lin);
        _lin = iVar8;
        local_c68 = std::
                    map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[](&corpus.sentencesPosDev,(key_type *)&lin);
        _lin = iVar8;
        sentenceUnkStrings =
             std::
             map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&corpus.sentencesStrDev,(key_type *)&lin);
        local_c88 = (double)CONCAT44(local_c88._4_4_,iVar8);
        _lin = iVar8;
        pmVar22 = std::
                  map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[](&corpus.correct_act_sentDev,(key_type *)&lin);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&pred,pmVar20);
        puVar1 = pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pkVar30 = pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (USE_SPELLING == false) {
          for (; pkVar30 != puVar1; pkVar30 = pkVar30 + 1) {
            sVar21 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(&training_vocab,pkVar30);
            if (sVar21 == 0) {
              *pkVar30 = kUNK;
            }
          }
        }
        cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&lin);
        pred_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pred_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pred_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (local_c04 != 1) break;
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        ParserBuilder::log_prob_parser
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,&parser,
                   (ComputationGraph *)&lin,pmVar20,&pred,local_c68,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&v,&corpus.actions,
                   &corpus.intToWords,&right_2);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&pred_1,&line);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&line);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&v);
        lVar25 = (long)(pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start;
        lVar26 = lVar25 >> 2;
        auVar39._8_4_ = (int)(lVar25 >> 0x22);
        auVar39._0_8_ = lVar26;
        auVar39._12_4_ = 0x45300000;
        line._M_string_length = line._M_string_length & 0xffffffff00000000;
        line.field_2._M_allocated_capacity = 0;
        line.field_2._8_8_ = &line._M_string_length;
        local_b98 = (double)CONCAT44(0x43300000,(int)lVar26) - 4503599627370496.0;
        dStack_b90 = auVar39._8_8_ - 1.9342813113834067e+25;
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish & 0xffffffff00000000);
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        ParserBuilder::compute_heads
                  (&hyp,(uint)((ulong)((long)(pmVar20->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pmVar20->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 2),
                   pmVar22,&corpus.actions,
                   (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&line);
        ParserBuilder::compute_heads
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   &tsentence_1,
                   (uint)((ulong)((long)(pmVar20->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pmVar20->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 2),&pred_1,
                   &corpus.actions,
                   (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&v);
        iVar8 = local_c88._0_4_;
        output_conll(pmVar20,local_c68,sentenceUnkStrings,&corpus.intToWords,&corpus.intToPos,
                     (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &tsentence_1,
                     (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&v);
        uVar6 = compute_correct((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                 *)&hyp._M_t,
                                (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                 *)&tsentence_1,
                                (int)((ulong)((long)(pmVar20->
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(pmVar20->
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2)
                                - 1);
        local_ca0 = local_ca0 + dStack_b90 + local_b98;
        local_c80 = local_c80 + (double)uVar6;
        lVar25 = ((long)(pmVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pmVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) + -1;
        auVar40._8_4_ = (int)((ulong)lVar25 >> 0x20);
        auVar40._0_8_ = lVar25;
        auVar40._12_4_ = 0x45300000;
        local_c98 = local_c98 +
                    (auVar40._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)&tsentence_1);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&hyp._M_t);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&v);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&line);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&pred_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&lin);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        iVar8 = iVar8 + 1;
      }
      abort();
    }
    pcVar29 = "unk_prob <= 1.";
  }
  __assert_fail(pcVar29,
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                ,0x3a5,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv) {
  cnn::Initialize(argc, argv);

  cerr << "COMMAND:"; 
  for (unsigned i = 0; i < static_cast<unsigned>(argc); ++i) cerr << ' ' << argv[i];
  cerr << endl;
  unsigned status_every_i_iterations = 100;

  po::variables_map conf;
  InitCommandLine(argc, argv, &conf);
  USE_POS = conf.count("use_pos_tags");

  USE_SPELLING=conf.count("use_spelling"); //Miguel
  corpus.USE_SPELLING=USE_SPELLING;

  LAYERS = conf["layers"].as<unsigned>();
  INPUT_DIM = conf["input_dim"].as<unsigned>();
  PRETRAINED_DIM = conf["pretrained_dim"].as<unsigned>();
  HIDDEN_DIM = conf["hidden_dim"].as<unsigned>();
  ACTION_DIM = conf["action_dim"].as<unsigned>();
  LSTM_INPUT_DIM = conf["lstm_input_dim"].as<unsigned>();
  POS_DIM = conf["pos_dim"].as<unsigned>();
  REL_DIM = conf["rel_dim"].as<unsigned>();
  const unsigned beam_size = conf["beam_size"].as<unsigned>();
  const unsigned unk_strategy = conf["unk_strategy"].as<unsigned>();
  cerr << "Unknown word strategy: ";
  if (unk_strategy == 1) {
    cerr << "STOCHASTIC REPLACEMENT\n";
  } else {
    abort();
  }
  const double unk_prob = conf["unk_prob"].as<double>();
  assert(unk_prob >= 0.); assert(unk_prob <= 1.);
  ostringstream os;
  os << "parser_" << (USE_POS ? "pos" : "nopos")
     << '_' << LAYERS
     << '_' << INPUT_DIM
     << '_' << HIDDEN_DIM
     << '_' << ACTION_DIM
     << '_' << LSTM_INPUT_DIM
     << '_' << POS_DIM
     << '_' << REL_DIM
     << "-pid" << getpid() << ".params";
  int best_correct_heads = 0;
  const string fname = os.str();
  cerr << "Writing parameters to file: " << fname << endl;
  bool softlinkCreated = false;
  corpus.load_correct_actions(conf["training_data"].as<string>());	
  const unsigned kUNK = corpus.get_or_add_word(cpyp::Corpus::UNK);
  kROOT_SYMBOL = corpus.get_or_add_word(ROOT_SYMBOL);

  if (conf.count("words")) {
    pretrained[kUNK] = vector<float>(PRETRAINED_DIM, 0);
    cerr << "Loading from " << conf["words"].as<string>() << " with" << PRETRAINED_DIM << " dimensions\n";
    ifstream in(conf["words"].as<string>().c_str());
    string line;
    getline(in, line);
    vector<float> v(PRETRAINED_DIM, 0);
    string word;
    while (getline(in, line)) {
      istringstream lin(line);
      lin >> word;
      for (unsigned i = 0; i < PRETRAINED_DIM; ++i) lin >> v[i];
      unsigned id = corpus.get_or_add_word(word);
      pretrained[id] = v;
    }
  }

  set<unsigned> training_vocab; // words available in the training corpus
  set<unsigned> singletons;
  {  // compute the singletons in the parser's training data
    map<unsigned, unsigned> counts;
    for (auto sent : corpus.sentences)
      for (auto word : sent.second) { training_vocab.insert(word); counts[word]++; }
    for (auto wc : counts)
      if (wc.second == 1) singletons.insert(wc.first);
  }

  cerr << "Number of words: " << corpus.nwords << endl;
  VOCAB_SIZE = corpus.nwords + 1;

  cerr << "Number of UTF8 chars: " << corpus.maxChars << endl;
  if (corpus.maxChars>255) CHAR_SIZE=corpus.maxChars;

  ACTION_SIZE = corpus.nactions + 1;
  //POS_SIZE = corpus.npos + 1;
  POS_SIZE = corpus.npos + 10;
  possible_actions.resize(corpus.nactions);
  for (unsigned i = 0; i < corpus.nactions; ++i)
    possible_actions[i] = i;

  Model model;
  ParserBuilder parser(&model, pretrained);
  if (conf.count("model")) {
    ifstream in(conf["model"].as<string>().c_str());
    boost::archive::text_iarchive ia(in);
    ia >> model;
  }

  // OOV words will be replaced by UNK tokens
  corpus.load_correct_actionsDev(conf["dev_data"].as<string>());
  if (USE_SPELLING) VOCAB_SIZE = corpus.nwords + 1;
  //TRAINING
  if (conf.count("train")) {
    signal(SIGINT, signal_callback_handler);
    SimpleSGDTrainer sgd(&model);
    //MomentumSGDTrainer sgd(&model);
    sgd.eta_decay = 0.08;
    //sgd.eta_decay = 0.05;
    cerr << "Training started."<<"\n";
    vector<unsigned> order(corpus.nsentences);
    for (unsigned i = 0; i < corpus.nsentences; ++i)
      order[i] = i;
    double tot_seen = 0;
    status_every_i_iterations = min(status_every_i_iterations, corpus.nsentences);
    unsigned si = corpus.nsentences;
    cerr << "NUMBER OF TRAINING SENTENCES: " << corpus.nsentences << endl;
    unsigned trs = 0;
    double right = 0;
    double llh = 0;
    bool first = true;
    int iter = -1;
    while(!requested_stop) {
      ++iter;
      for (unsigned sii = 0; sii < status_every_i_iterations; ++sii) {
           if (si == corpus.nsentences) {
             si = 0;
             if (first) { first = false; } else { sgd.update_epoch(); }
             cerr << "**SHUFFLE\n";
             random_shuffle(order.begin(), order.end());
           }
           tot_seen += 1;
           const vector<unsigned>& sentence=corpus.sentences[order[si]];
           vector<unsigned> tsentence=sentence;
           if (unk_strategy == 1) {
             for (auto& w : tsentence)
               if (singletons.count(w) && cnn::rand01() < unk_prob) w = kUNK;
           }
	   const vector<unsigned>& sentencePos=corpus.sentencesPos[order[si]]; 
	   const vector<unsigned>& actions=corpus.correct_act_sent[order[si]];
           ComputationGraph hg;
           parser.log_prob_parser(&hg,sentence,tsentence,sentencePos,actions,corpus.actions,corpus.intToWords,&right);
           double lp = as_scalar(hg.incremental_forward());
           if (lp < 0) {
             cerr << "Log prob < 0 on sentence " << order[si] << ": lp=" << lp << endl;
             assert(lp >= 0.0);
           }
           hg.backward();
           sgd.update(1.0);
           llh += lp;
           ++si;
           trs += actions.size();
      }
      sgd.status();
      cerr << "update #" << iter << " (epoch " << (tot_seen / corpus.nsentences) << ")\tllh: "<< llh<<" ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << endl;
      llh = trs = right = 0;

      static int logc = 0;
      ++logc;
      if (logc % 25 == 1) { // report on dev set
        unsigned dev_size = corpus.nsentencesDev;
        // dev_size = 100;
        double llh = 0;
        double trs = 0;
        double right = 0;
        double correct_heads = 0;
        double total_heads = 0;
        auto t_start = std::chrono::high_resolution_clock::now();
        for (unsigned sii = 0; sii < dev_size; ++sii) {
           const vector<unsigned>& sentence=corpus.sentencesDev[sii];
	   const vector<unsigned>& sentencePos=corpus.sentencesPosDev[sii]; 
	   const vector<unsigned>& actions=corpus.correct_act_sentDev[sii];
           vector<unsigned> tsentence=sentence;
	   if (!USE_SPELLING) {
                for (auto& w : tsentence)
                    if (training_vocab.count(w) == 0) w = kUNK;
           }

           ComputationGraph hg;
	   vector<unsigned> pred = parser.log_prob_parser(&hg,sentence,tsentence,sentencePos,vector<unsigned>(),corpus.actions,corpus.intToWords,&right);
	   double lp = 0;
           //vector<unsigned> pred = parser.log_prob_parser_beam(&hg,sentence,sentencePos,corpus.actions,beam_size,&lp);
           llh -= lp;
           trs += actions.size();
           map<int,int> ref = parser.compute_heads(sentence.size(), actions, corpus.actions);
           map<int,int> hyp = parser.compute_heads(sentence.size(), pred, corpus.actions);
           //output_conll(sentence, corpus.intToWords, ref, hyp);
           correct_heads += compute_correct(ref, hyp, sentence.size() - 1);
           total_heads += sentence.size() - 1;
        }
        auto t_end = std::chrono::high_resolution_clock::now();
        cerr << "  **dev (iter=" << iter << " epoch=" << (tot_seen / corpus.nsentences) << ")\tllh=" << llh << " ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << " uas: " << (correct_heads / total_heads) << "\t[" << dev_size << " sents in " << std::chrono::duration<double, std::milli>(t_end-t_start).count() << " ms]" << endl;
        if (correct_heads > best_correct_heads) {
          best_correct_heads = correct_heads;
          ofstream out(fname);
          boost::archive::text_oarchive oa(out);
          oa << model;
          // Create a soft link to the most recent model in order to make it
          // easier to refer to it in a shell script.
          if (!softlinkCreated) {
            string softlink = " latest_model";
            if (system((string("rm -f ") + softlink).c_str()) == 0 && 
                system((string("ln -s ") + fname + softlink).c_str()) == 0) {
              cerr << "Created " << softlink << " as a soft link to " << fname 
                   << " for convenience." << endl;
            }
            softlinkCreated = true;
          }
        }
      }
    }
  } // should do training?
  if (true) { // do test evaluation
    double llh = 0;
    double trs = 0;
    double right = 0;
    double correct_heads = 0;
    double total_heads = 0;
    auto t_start = std::chrono::high_resolution_clock::now();
    unsigned corpus_size = corpus.nsentencesDev;
    for (unsigned sii = 0; sii < corpus_size; ++sii) {
      const vector<unsigned>& sentence=corpus.sentencesDev[sii];
      const vector<unsigned>& sentencePos=corpus.sentencesPosDev[sii]; 
      const vector<string>& sentenceUnkStr=corpus.sentencesStrDev[sii]; 
      const vector<unsigned>& actions=corpus.correct_act_sentDev[sii];
      vector<unsigned> tsentence=sentence;
      if (!USE_SPELLING) {
        for (auto& w : tsentence)
	  if (training_vocab.count(w) == 0) w = kUNK;
      }
      ComputationGraph cg;
      double lp = 0;
      vector<unsigned> pred;
      if (beam_size == 1)
        pred = parser.log_prob_parser(&cg,sentence,tsentence,sentencePos,vector<unsigned>(),corpus.actions,corpus.intToWords,&right);
      else
        pred = parser.log_prob_parser_beam(&cg,sentence,tsentence,sentencePos,corpus.actions,beam_size,&lp);
      llh -= lp;
      trs += actions.size();
      map<int, string> rel_ref, rel_hyp;
      map<int,int> ref = parser.compute_heads(sentence.size(), actions, corpus.actions, &rel_ref);
      map<int,int> hyp = parser.compute_heads(sentence.size(), pred, corpus.actions, &rel_hyp);
      output_conll(sentence, sentencePos, sentenceUnkStr, corpus.intToWords, corpus.intToPos, hyp, rel_hyp);
      correct_heads += compute_correct(ref, hyp, sentence.size() - 1);
      total_heads += sentence.size() - 1;
    }
    auto t_end = std::chrono::high_resolution_clock::now();
    cerr << "TEST llh=" << llh << " ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << " uas: " << (correct_heads / total_heads) << "\t[" << corpus_size << " sents in " << std::chrono::duration<double, std::milli>(t_end-t_start).count() << " ms]" << endl;
  }
  for (unsigned i = 0; i < corpus.actions.size(); ++i) {
    //cerr << corpus.actions[i] << '\t' << parser.p_r->values[i].transpose() << endl;
    //cerr << corpus.actions[i] << '\t' << parser.p_p2a->values.col(i).transpose() << endl;
  }
}